

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_lifebane(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int dam_type;
  int iVar3;
  int iVar4;
  int iVar5;
  int dam_00;
  uint uVar6;
  char *pcVar7;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var8;
  bool inside;
  int tmp_dam;
  int dam;
  int sn_weaken;
  int sn_curse;
  int sn_poison;
  char buf [4608];
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  undefined4 in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed8c;
  CHAR_DATA *in_stack_ffffffffffffed90;
  CHAR_DATA *in_stack_ffffffffffffed98;
  undefined4 in_stack_ffffffffffffeda0;
  bool show;
  ulong uVar9;
  int dam_type_00;
  uint3 in_stack_ffffffffffffedb0;
  uint dt;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  int in_stack_ffffffffffffedd0;
  int in_stack_ffffffffffffedfc;
  CHAR_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *in_stack_ffffffffffffee08;
  int in_stack_ffffffffffffee10;
  int in_stack_ffffffffffffee14;
  int in_stack_ffffffffffffee4c;
  AFFECT_DATA *in_stack_ffffffffffffee50;
  CHAR_DATA *in_stack_ffffffffffffee58;
  int in_stack_ffffffffffffee60;
  int in_stack_ffffffffffffee64;
  CHAR_DATA *local_28;
  
  dt = (uint)in_stack_ffffffffffffedb0;
  dam_type = skill_lookup((char *)in_stack_ffffffffffffed98);
  iVar3 = skill_lookup((char *)in_stack_ffffffffffffed98);
  iVar4 = skill_lookup((char *)in_stack_ffffffffffffed98);
  uVar9 = in_RDX->in_room->room_flags[0];
  _Var8 = std::pow<int,int>(0,0x61fbdc);
  if (((uVar9 & (long)_Var8) != 0) || (in_RDX->in_room->sector_type == 7)) {
    dt = CONCAT13(1,(int3)dt);
  }
  iVar5 = dice((int)in_stack_ffffffffffffed90,in_stack_ffffffffffffed8c);
  pCVar1 = in_RDX->in_room->people;
  while (local_28 = pCVar1, local_28 != (CHAR_DATA *)0x0) {
    pCVar1 = local_28->next_in_room;
    bVar2 = is_safe(in_stack_ffffffffffffed90,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
    if ((!bVar2) && (((dt & 0x1000000) != 0 || (bVar2 = is_same_group(in_RDX,local_28), !bVar2)))) {
      dam_00 = iVar5;
      if (local_28 == in_RDX) {
        dam_00 = iVar5 / 2;
      }
      bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
      if (((!bVar2) &&
          (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88)
                         ), !bVar2)) &&
         ((in_RDX->fighting == (CHAR_DATA *)0x0 || (local_28->fighting == (CHAR_DATA *)0x0)))) {
        uVar6 = number_range((int)in_stack_ffffffffffffed90,in_stack_ffffffffffffed8c);
        if (uVar6 < 2) {
          in_stack_ffffffffffffed98 = (CHAR_DATA *)&stack0xffffffffffffedc8;
          pcVar7 = pers(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
          sprintf((char *)in_stack_ffffffffffffed98,"Die, %s you sorcerous dog!",pcVar7);
        }
        else if (uVar6 == 2) {
          in_stack_ffffffffffffed90 = (CHAR_DATA *)&stack0xffffffffffffedc8;
          pcVar7 = pers(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
          sprintf((char *)in_stack_ffffffffffffed90,"Help! %s is casting a spell on me!",pcVar7);
        }
        if (local_28 != in_RDX) {
          do_myell((CHAR_DATA *)CONCAT44(uVar6,in_stack_ffffffffffffeda0),
                   (char *)in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
        }
      }
      bVar2 = saves_spell(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,dam_type);
      show = SUB81(uVar9 >> 0x18,0);
      dam_type_00 = (int)(uVar9 >> 0x20);
      if (bVar2) {
        damage_old((CHAR_DATA *)CONCAT44(dam_type,iVar3),(CHAR_DATA *)CONCAT44(iVar4,iVar5),dam_00,
                   dt,dam_type_00,show);
      }
      else {
        damage_old((CHAR_DATA *)CONCAT44(dam_type,iVar3),(CHAR_DATA *)CONCAT44(iVar4,iVar5),dam_00,
                   dt,dam_type_00,show);
      }
      spell_poison(in_stack_ffffffffffffee14,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,
                   in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
      spell_weaken(in_stack_ffffffffffffee14,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,
                   in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
      spell_curse(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                  in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c);
    }
  }
  return;
}

Assistant:

void spell_lifebane(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	char buf[MAX_STRING_LENGTH];

	int sn_poison, sn_curse, sn_weaken;
	int dam, tmp_dam;
	bool inside = false;

	sn_poison = skill_lookup("poison");
	sn_curse = skill_lookup("curse");
	sn_weaken = skill_lookup("weaken");

	if (IS_SET(ch->in_room->room_flags, ROOM_INDOORS) || ch->in_room->sector_type == SECT_INSIDE)
		inside = true;

	dam = dice(level, 4);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch))
			continue;

		if (!(inside) && is_same_group(ch, vch))
			continue;

		tmp_dam = dam;

		if (vch == ch)
			tmp_dam /= 2;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			switch (number_range(0, 2))
			{
				case 0:
				case 1:
					sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, vch));
					break;
				case 2:
					sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, vch));
			}

			if (vch != ch)
				do_myell(vch, buf, ch);
		}

		if (saves_spell(level, vch, DAM_NEGATIVE))
			damage_old(ch, vch, dam / 2, sn, DAM_NEGATIVE, true);
		else
			damage_old(ch, vch, dam, sn, DAM_NEGATIVE, true);

		spell_poison(sn_poison, level - 5, ch, vch, target);
		spell_weaken(sn_weaken, level - 5, ch, vch, target);
		spell_curse(sn_curse, level - 8, ch, vch, target);
	}
}